

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O1

void __thiscall cmCPackComponentGroup::~cmCPackComponentGroup(cmCPackComponentGroup *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  ppcVar1 = (this->Subgroups).
            super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->Subgroups).
                                  super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1
                   );
  }
  ppcVar2 = (this->Components).
            super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->Components).
                                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
  }
  pcVar3 = (this->Description)._M_dataplus._M_p;
  paVar4 = &(this->Description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->DisplayName)._M_dataplus._M_p;
  paVar4 = &(this->DisplayName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->Name)._M_dataplus._M_p;
  paVar4 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCPackComponentGroup()
    : IsBold(false)
    , IsExpandedByDefault(false)
  {
  }